

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# option_button.cpp
# Opt level: O1

void option_button_draw_proc(Am_Object *self,Am_Drawonable *draw,int x_offset,int y_offset)

{
  uint *puVar1;
  bool bVar2;
  bool key_selected;
  bool fringe;
  int iVar3;
  int iVar4;
  int iVar5;
  int height;
  int iVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  Am_Value *pAVar11;
  undefined4 extraout_var;
  char *pcVar14;
  char *pcVar15;
  size_t sVar16;
  ostream *poVar17;
  uint uVar18;
  Am_Style *prev;
  uint top;
  long lVar19;
  Am_Object obj;
  Am_Widget_Look look;
  Am_String string;
  Am_Font font;
  Computed_Colors_Record color_rec;
  Am_Style style;
  Am_Value value;
  Am_Object local_70;
  Am_Font local_68;
  Am_Object local_60;
  Am_Font local_58;
  Am_Object local_50;
  int descent;
  int ascent;
  int b;
  int a;
  int str_width;
  ulong uVar12;
  ulong uVar13;
  
  pAVar11 = Am_Object::Get(self,100,0);
  iVar3 = Am_Value::operator_cast_to_int(pAVar11);
  pAVar11 = Am_Object::Get(self,0x65,0);
  iVar4 = Am_Value::operator_cast_to_int(pAVar11);
  pAVar11 = Am_Object::Get(self,0x66,0);
  iVar5 = Am_Value::operator_cast_to_int(pAVar11);
  uVar12 = CONCAT44(extraout_var,iVar5);
  pAVar11 = Am_Object::Get(self,0x67,0);
  height = Am_Value::operator_cast_to_int(pAVar11);
  pAVar11 = Am_Object::Get(self,0xcc,0);
  bVar2 = Am_Value::operator_cast_to_bool(pAVar11);
  pAVar11 = Am_Object::Get(self,0x17c,0);
  key_selected = Am_Value::operator_cast_to_bool(pAVar11);
  pAVar11 = Am_Object::Get(self,0x1c7,0);
  fringe = Am_Value::operator_cast_to_bool(pAVar11);
  Am_Font::Am_Font(&font,Am_FONT_FIXED,false,false,false,Am_FONT_MEDIUM);
  pAVar11 = Am_Object::Get(self,0xac,0);
  Am_Font::operator=(&font,pAVar11);
  pAVar11 = Am_Object::Get(self,0x1ad,0);
  color_rec.data = (Computed_Colors_Record_Data *)(pAVar11->value).wrapper_value;
  if (color_rec.data != (Computed_Colors_Record_Data *)0x0) {
    puVar1 = &((color_rec.data)->super_Am_Wrapper).refs;
    *puVar1 = *puVar1 + 1;
  }
  pAVar11 = Am_Object::Get(self,0x17f,0);
  look.value = Am_MOTIF_LOOK_val;
  if ((pAVar11->type != 1) && (pAVar11->type != Am_Widget_Look::Am_Widget_Look_ID)) {
    Am_Widget_Look::TypeError(&look,pAVar11);
  }
  look.value = (Am_Widget_Look_vals)(pAVar11->value).float_value;
  string.data = (Am_String_Data *)0x0;
  obj.data = (Am_Object_Data *)0x0;
  value.type = 0;
  value.value.wrapper_value = (Am_Wrapper *)0x0;
  pAVar11 = Am_Object::Get(self,0x1ae,1);
  Am_Value::operator=(&value,pAVar11);
  if (value.type == 0xa001) {
    Am_Object::operator=(&obj,&value);
  }
  else {
    if (value.type != 0x8008) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"** Amulet_Error: ",0x11);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"String slot of widget ",0x16);
      poVar17 = operator<<((ostream *)&std::cerr,self);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar17," should have string or object type, but value is ",0x31);
      poVar17 = operator<<(poVar17,&value);
      std::endl<char,std::char_traits<char>>(poVar17);
      Am_Error();
    }
    Am_String::operator=(&string,&value);
  }
  pAVar11 = Am_Object::Get(self,0x1cd,0);
  iVar6 = Am_Value::operator_cast_to_int(pAVar11);
  uVar7 = iVar3 + x_offset;
  uVar13 = (ulong)uVar7;
  top = iVar4 + y_offset;
  if (look.value == Am_MOTIF_LOOK_val) {
    pcVar14 = Am_String::operator_cast_to_char_(&string);
    Am_Object::Am_Object(&local_50,&obj);
    Am_Font::Am_Font(&local_58,&font);
    Am_Draw_Button_Widget
              (uVar7,top,iVar5,height,pcVar14,&local_50,false,false,bVar2,key_selected,false,fringe,
               (Am_Font_Data *)&local_58,&color_rec,look,Am_PUSH_BUTTON,draw,0,0,false,Am_LEFT_ALIGN
               ,iVar6,false);
    Am_Font::~Am_Font(&local_58);
    Am_Object::~Am_Object(&local_50);
    (*draw->_vptr_Am_Drawonable[0x21])(draw,uVar13,(ulong)top,uVar12);
    Am_Draw_Motif_Box(iVar5 + uVar7 + -0x18,((height - (height + -8 >> 0x1f)) + -8 >> 1) + top,0xc,8
                      ,false,&color_rec,draw);
    (*draw->_vptr_Am_Drawonable[0x22])(draw);
  }
  else if (look.value == Am_WINDOWS_LOOK_val) {
    pcVar14 = Am_String::operator_cast_to_char_(&string);
    Am_Object::Am_Object(&local_60,&obj);
    Am_Font::Am_Font(&local_68,&font);
    Am_Draw_Button_Widget
              (uVar7,top,iVar5,height,pcVar14,&local_60,false,false,bVar2,key_selected,false,fringe,
               (Am_Font_Data *)&local_68,&color_rec,look,Am_PUSH_BUTTON,draw,0,0,false,Am_LEFT_ALIGN
               ,iVar6,false);
    Am_Font::~Am_Font(&local_68);
    Am_Object::~Am_Object(&local_60);
    draw_down_arrow(iVar5 + uVar7 + -0x10,top,0x10,height,Am_WINDOWS_LOOK,false,true,true,&color_rec
                    ,draw);
  }
  else {
    if (look.value != Am_MACINTOSH_LOOK_val) {
      Am_Error("Unknown Look parameter");
    }
    if (fringe) {
      uVar13 = (ulong)(uVar7 + 4);
      top = top + 4;
      uVar12 = (ulong)(iVar5 - 8);
      height = height + -8;
    }
    iVar3 = (int)uVar13;
    iVar4 = (int)uVar12;
    uVar7 = height - 3;
    (*draw->_vptr_Am_Drawonable[0x2c])
              (draw,&Am_Black,&Am_No_Style,(ulong)(iVar3 + 3),(ulong)(top + 3),(ulong)(iVar4 - 3),
               (ulong)uVar7,0);
    prev = &Am_Black;
    (*draw->_vptr_Am_Drawonable[0x2c])
              (draw,&Am_Black,&Am_White,uVar13,(ulong)top,(ulong)(iVar4 - 1),(ulong)(height - 1),0);
    if (!bVar2) {
      prev = &Am_Motif_Inactive_Stipple;
    }
    Am_Style::Am_Style(&style,prev);
    pcVar14 = Am_String::operator_cast_to_char_(&string);
    iVar5 = iVar3 + 1;
    if (pcVar14 == (char *)0x0) {
      bVar2 = Am_Object::Valid(&obj);
      if (bVar2) {
        pAVar11 = Am_Object::Get(&obj,0x66,0);
        iVar6 = Am_Value::operator_cast_to_int(pAVar11);
        pAVar11 = Am_Object::Get(&obj,0x67,0);
        iVar8 = Am_Value::operator_cast_to_int(pAVar11);
        pAVar11 = Am_Object::Get(&obj,100,0);
        iVar9 = Am_Value::operator_cast_to_int(pAVar11);
        pAVar11 = Am_Object::Get(&obj,0x65,0);
        iVar10 = Am_Value::operator_cast_to_int(pAVar11);
        Am_Object::Am_Object(&local_70,&obj);
        Am_Draw(&local_70,draw,
                ((((iVar4 - iVar6) - ((iVar4 - iVar6) + -0x17 >> 0x1f)) + -0x17 >> 1) + iVar5) -
                iVar9,((top + (int)(uVar7 - iVar8) / 2) - iVar10) + 3);
        Am_Object::~Am_Object(&local_70);
      }
    }
    else {
      pcVar14 = Am_String::operator_cast_to_char_(&string);
      pcVar15 = Am_String::operator_cast_to_char_(&string);
      sVar16 = strlen(pcVar15);
      (*draw->_vptr_Am_Drawonable[0x1a])
                (draw,&font,pcVar14,sVar16 & 0xffffffff,&str_width,&ascent,&descent,&a,&b);
      pcVar14 = Am_String::operator_cast_to_char_(&string);
      pcVar15 = Am_String::operator_cast_to_char_(&string);
      sVar16 = strlen(pcVar15);
      (*draw->_vptr_Am_Drawonable[0x2e])
                (draw,&style,pcVar14,sVar16 & 0xffffffff,&font,(ulong)(uint)(iVar6 + iVar5),
                 (ulong)((int)(uVar7 - (ascent + descent)) / 2 + top + 1),0,&Am_No_Style,0);
    }
    uVar7 = (iVar4 + iVar3) - 7;
    lVar19 = 0;
    do {
      uVar18 = top + 1 + ((height - (height + -9 >> 0x1f)) + -9 >> 1) + (int)lVar19;
      (*draw->_vptr_Am_Drawonable[0x28])
                (draw,&style,(ulong)(uint)(iVar4 + iVar5 + -0x12 + (int)lVar19),(ulong)uVar18,
                 (ulong)uVar7,(ulong)uVar18,0);
      lVar19 = lVar19 + 1;
      uVar7 = uVar7 - 1;
    } while (lVar19 != 6);
    Am_Style::~Am_Style(&style);
  }
  Am_Value::~Am_Value(&value);
  Am_Object::~Am_Object(&obj);
  Am_String::~Am_String(&string);
  if (color_rec.data != (Computed_Colors_Record_Data *)0x0) {
    puVar1 = &((color_rec.data)->super_Am_Wrapper).refs;
    *puVar1 = *puVar1 - 1;
    if (*puVar1 == 0) {
      (*((color_rec.data)->super_Am_Wrapper).super_Am_Registered_Type._vptr_Am_Registered_Type[4])()
      ;
    }
  }
  Am_Font::~Am_Font(&font);
  return;
}

Assistant:

Am_Define_Method(Am_Draw_Method, void, option_button_draw,
                 (Am_Object self, Am_Drawonable *draw, int x_offset,
                  int y_offset))
{
  int left = (int)self.Get(Am_LEFT) + x_offset;
  int top = (int)self.Get(Am_TOP) + y_offset;
  int width = self.Get(Am_WIDTH);
  int height = self.Get(Am_HEIGHT);
  bool active = self.Get(Am_ACTIVE);
  bool key_selected = self.Get(Am_KEY_SELECTED);
  bool fringe = self.Get(Am_LEAVE_ROOM_FOR_FRINGE);
  Am_Font font;
  font = self.Get(Am_FONT);
  Computed_Colors_Record color_rec = self.Get(Am_STYLE_RECORD);
  Am_Widget_Look look = self.Get(Am_WIDGET_LOOK);

  // now find the contents to draw in the button
  Am_String string;
  Am_Object obj;
  Am_Value value;

  // string slot contains a formula which gets the real object based on the
  // value of the COMMAND slot
  value = self.Peek(Am_REAL_STRING_OR_OBJ);
  if (value.type == Am_STRING)
    string = value;
  else if (value.type == Am_OBJECT)
    obj = value;
  else
    Am_ERRORO("String slot of widget "
                  << self << " should have string or object type, but value is "
                  << value,
              self, 0);

  int offset = self.Get(Am_MENU_ITEM_LEFT_OFFSET);

  // finally ready to draw it
  switch (look.value) {
  case Am_MOTIF_LOOK_val: {
    Am_Draw_Button_Widget(left, top, width, height, string, obj, false, false,
                          active, key_selected, false, fringe, font, color_rec,
                          look, Am_PUSH_BUTTON, draw, 0, 0, false,
                          Am_LEFT_ALIGN, offset);

    //now draw notch
    int x = left + width - NOTCH_OFFSET - NOTCH_WIDTH - 4;
    //center in Y
    int y = top + (height - NOTCH_HEIGHT) / 2;
    draw->Push_Clip(left, top, width, height);
    Am_Draw_Motif_Box(x, y, NOTCH_WIDTH, NOTCH_HEIGHT, false, color_rec, draw);
    draw->Pop_Clip();
    break;
  }

  case Am_WINDOWS_LOOK_val:
    Am_Draw_Button_Widget(left, top, width, height, string, obj, false, false,
                          active, key_selected, false, fringe, font, color_rec,
                          look, Am_PUSH_BUTTON, draw, 0, 0, false,
                          Am_LEFT_ALIGN, offset);
    draw_down_arrow(left + width - 16, top, 16, height, Am_WINDOWS_LOOK, false,
                    true, true, color_rec, draw);
    break;

  case Am_MACINTOSH_LOOK_val: {
    if (fringe) {
      left += 4;
      top += 4;
      width -= 8;
      height -= 8;
    }

    draw->Draw_Rectangle(Am_Black, Am_No_Style, left + 3, top + 3, width - 3,
                         height - 3);
    draw->Draw_Rectangle(Am_Black, Am_White, left, top, width - 1, height - 1);

    left += 1;
    top += 1;
    width -= 3;
    height -= 3;

    Am_Style style = active ? Am_Black : Am_Motif_Inactive_Stipple;

    if ((const char *)string) {
      int str_width, ascent, descent, a, b, str_left, str_top;

      draw->Get_String_Extents(font, string, strlen(string), str_width, ascent,
                               descent, a, b);

      str_left = offset + left;
      str_top = top + (height - ascent - descent) / 2;

      draw->Draw_Text(style, string, strlen(string), font, str_left, str_top);

    } else if (obj.Valid()) {
      int obj_width = obj.Get(Am_WIDTH), obj_height = obj.Get(Am_HEIGHT);
      int obj_left = obj.Get(Am_LEFT), obj_top = obj.Get(Am_TOP);
      int final_left = (width - 20 - obj_width) / 2,
          final_top = 2 + (height - obj_height) / 2;

      Am_Draw(obj, draw, left - obj_left + final_left,
              top - obj_top + final_top);
    }

    // draw little down arrow
    int tri_x = left + width - 15, tri_y = top + (height - 6) / 2,
        len =
            10; // len - is really 11, but one extra pixel is drawn to the right
    for (long i = 1; i <= 6; i++) {
      draw->Draw_Line(style, tri_x, tri_y, tri_x + len, tri_y);
      tri_x++;
      tri_y++;
      len -= 2;
    }
    break;
  }

  default:
    Am_Error("Unknown Look parameter");
    break;
  }
}